

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_iterative.c
# Opt level: O2

SUNErrCode
SUNClassicalGS(N_Vector *v,sunrealtype **h,int k,int p,sunrealtype *new_vk_norm,sunrealtype *stemp,
              N_Vector *vtemp)

{
  N_Vector z;
  int nvec;
  int iVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  sunrealtype sVar6;
  double dVar7;
  sunrealtype sVar8;
  double dVar9;
  
  iVar1 = k + -1;
  uVar4 = (ulong)(uint)p;
  if (k < p) {
    uVar4 = (ulong)(uint)k;
  }
  uVar2 = 0;
  if (0 < k - p) {
    uVar2 = (ulong)(uint)(k - p);
  }
  nvec = (int)uVar4;
  lVar5 = (long)k;
  N_VDotProdMulti(nvec + 1,v[lVar5],v + uVar2,stemp);
  dVar7 = stemp[nvec];
  dVar9 = 0.0;
  if (0.0 < dVar7) {
    if (dVar7 < 0.0) {
      dVar9 = sqrt(dVar7);
    }
    else {
      dVar9 = SQRT(dVar7);
    }
  }
  if (lVar5 <= p) {
    p = k;
  }
  for (lVar3 = 0; 0 < p + (int)lVar3; lVar3 = lVar3 + -1) {
    sVar6 = stemp[uVar4 + lVar3 + -1];
    h[uVar4 + lVar3 + -1][iVar1] = sVar6;
    stemp[uVar4 + lVar3] = -sVar6;
    vtemp[uVar4 + lVar3] = v[uVar4 + lVar3 + -1];
  }
  *stemp = 1.0;
  z = v[lVar5];
  *vtemp = z;
  N_VLinearCombination(nvec + 1,stemp,vtemp,z);
  sVar6 = N_VDotProd(v[lVar5],v[lVar5]);
  dVar7 = 0.0;
  if (0.0 < sVar6) {
    sVar6 = N_VDotProd(v[lVar5],v[lVar5]);
    if (sVar6 < 0.0) {
      dVar7 = sqrt(sVar6);
    }
    else {
      dVar7 = SQRT(sVar6);
    }
  }
  *new_vk_norm = dVar7;
  if (dVar7 * 1000.0 < dVar9) {
    N_VDotProdMulti(nvec,v[lVar5],v + uVar2,stemp + 1);
    *stemp = 1.0;
    *vtemp = v[lVar5];
    for (lVar3 = 0; (long)(lVar3 + uVar2) < lVar5; lVar3 = lVar3 + 1) {
      h[uVar2 + lVar3][iVar1] = stemp[lVar3 + 1] + h[uVar2 + lVar3][iVar1];
      stemp[lVar3 + 1] = -stemp[lVar3 + 1];
      vtemp[lVar3 + 1] = v[lVar3];
    }
    N_VLinearCombination(k + 1,stemp,vtemp,v[lVar5]);
    sVar6 = N_VDotProd(v[lVar5],v[lVar5]);
    sVar8 = 0.0;
    if (0.0 < sVar6) {
      sVar8 = N_VDotProd(v[lVar5],v[lVar5]);
      if (sVar8 < 0.0) {
        sVar8 = sqrt(sVar8);
      }
      else {
        sVar8 = SQRT(sVar8);
      }
    }
    *new_vk_norm = sVar8;
  }
  return 0;
}

Assistant:

SUNErrCode SUNClassicalGS(N_Vector* v, sunrealtype** h, int k, int p,
                          sunrealtype* new_vk_norm, sunrealtype* stemp,
                          N_Vector* vtemp)
{
  SUNFunctionBegin(v[0]->sunctx);
  int i, i0, k_minus_1;
  sunrealtype vk_norm;

  k_minus_1 = k - 1;
  i0        = SUNMAX(k - p, 0);

  /* Perform Classical Gram-Schmidt */

  SUNCheckCall(N_VDotProdMulti(k - i0 + 1, v[k], v + i0, stemp));

  vk_norm = SUNRsqrt(stemp[k - i0]);
  for (i = k - i0 - 1; i >= 0; i--)
  {
    h[i][k_minus_1] = stemp[i];
    stemp[i + 1]    = -stemp[i];
    vtemp[i + 1]    = v[i];
  }
  stemp[0] = ONE;
  vtemp[0] = v[k];

  SUNCheckCall(N_VLinearCombination(k - i0 + 1, stemp, vtemp, v[k]));

  /* Compute the norm of the new vector at v[k] */

  *new_vk_norm = SUNRsqrt(N_VDotProd(v[k], v[k]));
  SUNCheckLastErr();

  /* Reorthogonalize if necessary */

  if ((FACTOR * (*new_vk_norm)) < vk_norm)
  {
    SUNCheckCall(N_VDotProdMulti(k - i0, v[k], v + i0, stemp + 1));

    stemp[0] = ONE;
    vtemp[0] = v[k];
    for (i = i0; i < k; i++)
    {
      h[i][k_minus_1] += stemp[i - i0 + 1];
      stemp[i - i0 + 1] = -stemp[i - i0 + 1];
      vtemp[i - i0 + 1] = v[i - i0];
    }

    SUNCheckCall(N_VLinearCombination(k + 1, stemp, vtemp, v[k]));

    *new_vk_norm = SUNRsqrt(N_VDotProd(v[k], v[k]));
    SUNCheckLastErr();
  }

  return SUN_SUCCESS;
}